

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O2

int get_line(FILE *f,char *hash,char *filename,int verbose,int *size)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  char *__s;
  int iVar9;
  long lVar10;
  
  iVar2 = (int)filename;
  while ((iVar3 = feof((FILE *)f), iVar3 == 0 &&
         (pcVar5 = fgets(filename,0x1000,(FILE *)f), pcVar5 != (char *)0x0))) {
    pcVar5 = filename + -2;
    lVar7 = 0;
    do {
      lVar10 = lVar7;
      pcVar5 = pcVar5 + 1;
      lVar7 = lVar10 + 1;
    } while (filename[lVar10] == ' ');
    __s = filename + lVar10;
    sVar6 = strlen(__s);
    lVar7 = (long)(int)sVar6;
    for (lVar8 = 0; (pcVar5[lVar8 + lVar7] == '\r' || (pcVar5[lVar8 + lVar7] == '\n'));
        lVar8 = lVar8 + -1) {
      pcVar5[lVar8 + lVar7] = '\0';
    }
    if (((1 - lVar7 != lVar8) && (pcVar5 = strchr(__s,0x20), pcVar5 != (char *)0x0)) &&
       (pcVar5[1] != '\0')) {
      iVar3 = (int)pcVar5;
      iVar9 = (int)(lVar10 + 1);
      *size = ((1 - iVar2) + iVar3) - iVar9;
      lVar7 = 0;
      do {
        if (((1 - iVar2) + iVar3) - iVar9 <= lVar7) {
          iVar4 = ((1 - iVar2) + iVar3) - iVar9;
          if ((iVar4 < 0x81) && ((iVar4 == 0x40 || (iVar4 == 0x80)))) {
            memcpy(hash,__s,(ulong)(((iVar3 - iVar2) - iVar9) + 1));
            hash[*size] = '\0';
          }
          else {
            *size = 0;
            memset(hash,0,0x81);
          }
          sVar6 = strlen(pcVar5);
          memmove(filename,pcVar5 + 1,sVar6);
          *size = *size / 2;
          return 1;
        }
        bVar1 = filename[lVar7 + lVar10];
      } while ((('/' < (char)bVar1) && (6 < (byte)(bVar1 - 0x3a))) &&
              ((bVar1 < 0x67 && (lVar7 = lVar7 + 1, 0x19 < (byte)(bVar1 + 0xb9)))));
    }
    if (verbose != 0) {
      printf("Skipping line %s\n",filename);
    }
  }
  return 0;
}

Assistant:

int get_line(FILE *f, char *hash, char *filename, int verbose, int *size)
{
    int i, len;
    char *ptr = filename;
    char *spacepos = NULL;

    while (!feof(f)) {
        if (!fgets(filename, PATH_MAX, f))
            return 0;
        ptr = filename;
        while (*ptr == ' ')
            ptr++;

        len = strlen(ptr);
        while (ptr[--len] == '\n' || ptr[len] == '\r')
            ptr[len] = 0;

        if (len == 0)
            goto nextline;

        spacepos = strchr(ptr, ' ');
        if (spacepos == NULL || strlen(spacepos + 1) == 0)
            goto nextline;

        *size = spacepos - ptr;

        for (i = 0; i < *size; i++) {
            if (ptr[i] < '0' || (ptr[i] > '9' && ptr[i] < 'A') ||
                (ptr[i] > 'F' && ptr[i] < 'a') || ptr[i] > 'f') {
                goto nextline;
            }
        }

        if (*size > 128 || ((*size != 64) && (*size != 128))) {
            *size = 0;
            memset(hash, 0, MAX_HASH_TXT_BYTES + 1);
        } else {
            memcpy(hash, ptr, *size);
            hash[*size] = 0;
        }
        memmove(filename, spacepos + 1, strlen(spacepos));

        *size /= 2;
        return 1;
 nextline:
        if (verbose)
            printf("Skipping line %s\n", filename);
    }
    return 0;
}